

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall PSVIWriterHandlers::endPrefixMapping(PSVIWriterHandlers *this,XMLCh *prefix)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  bool bVar1;
  XMLSize_t XVar2;
  char16_t *pcVar3;
  ulong uVar4;
  char16_t *local_30;
  XMLCh *pre;
  XMLCh *uri;
  XMLCh *pXStack_18;
  uint i;
  XMLCh *prefix_local;
  PSVIWriterHandlers *this_local;
  
  uri._4_4_ = 0;
  pXStack_18 = prefix;
  prefix_local = (XMLCh *)this;
  while( true ) {
    uVar4 = (ulong)uri._4_4_;
    XVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::size
                      (&this->fNamespaces->super_BaseRefVectorOf<char16_t>);
    if (XVar2 <= uVar4) {
      return;
    }
    this_00 = this->fPrefixMap;
    pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&this->fNamespaces->super_BaseRefVectorOf<char16_t>,(ulong)uri._4_4_);
    pcVar3 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this_00,pcVar3);
    bVar1 = xercesc_4_0::XMLString::equals(pcVar3,pXStack_18);
    if (bVar1) break;
    uri._4_4_ = uri._4_4_ + 1;
  }
  pre = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                  (&this->fNamespaces->super_BaseRefVectorOf<char16_t>,(ulong)uri._4_4_);
  local_30 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                       (this->fPrefixMap,pre);
  xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey(this->fPrefixMap,pre);
  (*(this->fNamespaces->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[4])
            (this->fNamespaces,(ulong)uri._4_4_);
  xercesc_4_0::XMLString::release(&pre,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_30,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void PSVIWriterHandlers::endPrefixMapping(const XMLCh* const prefix) {
	for (unsigned int i=0; i < fNamespaces->size(); i++) {
		if (XMLString::equals(fPrefixMap->get(fNamespaces->elementAt(i)), prefix)) {
			XMLCh* uri = fNamespaces->elementAt(i);
			XMLCh* pre = fPrefixMap->get(uri);
			fPrefixMap->removeKey(uri);
			fNamespaces->removeElementAt(i);
			XMLString::release(&uri);
			XMLString::release(&pre);
			break;
		}
	}
}